

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# as-02-wrap.cpp
# Opt level: O3

CommandOptions * write_isxd_file(CommandOptions *Options)

{
  string *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  _Alloc_hider _Var5;
  char cVar6;
  int iVar7;
  AESEncContext *this;
  HMACContext *this_00;
  ulong extraout_RAX;
  long lVar8;
  uint uVar9;
  long in_RSI;
  MyInfo *pMVar10;
  undefined1 *puVar11;
  WriterInfo *pWVar12;
  long *plVar13;
  byte bVar14;
  FortunaRNG RNG;
  undefined4 uStack_29c;
  undefined1 local_290;
  undefined7 uStack_28f;
  string namespace_name;
  ui32_t read_count;
  MXFWriter Writer;
  byte_t IV_buf [16];
  byte_t local_228;
  byte_t abStack_227 [7];
  int local_220;
  SequenceParser Parser;
  WriterInfo Info;
  Result_t result;
  AttributeList doc_attr_list;
  AttributeList doc_attr_list_1;
  FrameBuffer FrameBuffer;
  
  bVar14 = 0;
  AS_02::ISXD::MXFWriter::MXFWriter(&Writer);
  ASDCP::DCData::FrameBuffer::FrameBuffer(&FrameBuffer,*(ui32_t *)(in_RSI + 0x20));
  ASDCP::DCData::SequenceParser::SequenceParser(&Parser);
  ASDCP::DCData::SequenceParser::OpenRead((string *)&result);
  if ((-1 < _result) &&
     ((*(char *)(in_RSI + 5) == '\0' || (write_isxd_file(), (extraout_RAX & 1) != 0)))) {
    if (*(char *)(in_RSI + 0xc) == '\0') {
      pMVar10 = &s_MyInfo;
      pWVar12 = &Info;
      for (lVar8 = 8; lVar8 != 0; lVar8 = lVar8 + -1) {
        *(undefined8 *)pWVar12->ProductUUID = *(undefined8 *)(pMVar10->super_WriterInfo).ProductUUID
        ;
        pMVar10 = (MyInfo *)((long)pMVar10 + ((ulong)bVar14 * -2 + 1) * 8);
        pWVar12 = (WriterInfo *)((long)pWVar12 + (ulong)bVar14 * -0x10 + 8);
      }
      Info.EncryptedEssence = s_MyInfo.super_WriterInfo.EncryptedEssence;
      Info.UsesHMAC = s_MyInfo.super_WriterInfo.UsesHMAC;
      Info.ProductVersion._M_dataplus._M_p = (pointer)&Info.ProductVersion.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&Info.ProductVersion,
                 s_MyInfo.super_WriterInfo.ProductVersion._M_dataplus._M_p,
                 s_MyInfo.super_WriterInfo.ProductVersion._M_dataplus._M_p +
                 s_MyInfo.super_WriterInfo.ProductVersion._M_string_length);
      paVar3 = &Info.CompanyName.field_2;
      Info.CompanyName._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&Info.CompanyName,s_MyInfo.super_WriterInfo.CompanyName._M_dataplus._M_p,
                 s_MyInfo.super_WriterInfo.CompanyName._M_dataplus._M_p +
                 s_MyInfo.super_WriterInfo.CompanyName._M_string_length);
      paVar4 = &Info.ProductName.field_2;
      Info.ProductName._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&Info.ProductName,s_MyInfo.super_WriterInfo.ProductName._M_dataplus._M_p,
                 s_MyInfo.super_WriterInfo.ProductName._M_dataplus._M_p +
                 s_MyInfo.super_WriterInfo.ProductName._M_string_length);
      Info.LabelSetType = s_MyInfo.super_WriterInfo.LabelSetType;
      if (*(char *)(in_RSI + 2) == '\x01') {
        Info.AssetUUID._0_8_ = *(undefined8 *)(in_RSI + 0x45);
        Info.AssetUUID._8_8_ = *(undefined8 *)(in_RSI + 0x4d);
      }
      else {
        Kumu::GenRandomUUID(Info.AssetUUID);
      }
      Info.LabelSetType = LS_MXF_SMPTE;
      if (*(char *)(in_RSI + 1) == '\x01') {
        Kumu::FortunaRNG::FortunaRNG(&RNG);
        Kumu::GenRandomUUID(Info.ContextID);
        Info.EncryptedEssence = true;
        if (*(char *)(in_RSI + 0x34) == '\x01') {
          Info.CryptographicKeyID._0_4_ = *(undefined4 *)(in_RSI + 0x35);
          Info.CryptographicKeyID._4_4_ = *(undefined4 *)(in_RSI + 0x39);
          Info.CryptographicKeyID._8_4_ = *(undefined4 *)(in_RSI + 0x3d);
          Info.CryptographicKeyID._12_4_ = *(uint *)(in_RSI + 0x41);
        }
        else {
          doc_attr_list.super__List_base<Kumu::NVPair,_std::allocator<Kumu::NVPair>_>._M_impl.
          _M_node.super__List_node_base._M_prev._0_1_ = 0;
          doc_attr_list.super__List_base<Kumu::NVPair,_std::allocator<Kumu::NVPair>_>._M_impl.
          _M_node.super__List_node_base._M_prev._1_1_ = '\0';
          doc_attr_list.super__List_base<Kumu::NVPair,_std::allocator<Kumu::NVPair>_>._M_impl.
          _M_node.super__List_node_base._M_prev._2_1_ = '\0';
          doc_attr_list.super__List_base<Kumu::NVPair,_std::allocator<Kumu::NVPair>_>._M_impl.
          _M_node.super__List_node_base._M_prev._3_1_ = '\0';
          doc_attr_list.super__List_base<Kumu::NVPair,_std::allocator<Kumu::NVPair>_>._M_impl.
          _M_node.super__List_node_base._M_prev._4_1_ = '\0';
          doc_attr_list.super__List_base<Kumu::NVPair,_std::allocator<Kumu::NVPair>_>._M_impl.
          _M_node._13_4_ = 0;
          doc_attr_list.super__List_base<Kumu::NVPair,_std::allocator<Kumu::NVPair>_>._M_impl.
          _M_node._M_size._1_1_ = '\0';
          doc_attr_list.super__List_base<Kumu::NVPair,_std::allocator<Kumu::NVPair>_>._M_impl.
          _M_node._M_size._2_1_ = '\0';
          doc_attr_list.super__List_base<Kumu::NVPair,_std::allocator<Kumu::NVPair>_>._M_impl.
          _M_node._M_size._3_1_ = '\0';
          doc_attr_list.super__List_base<Kumu::NVPair,_std::allocator<Kumu::NVPair>_>._M_impl.
          _M_node._M_size._4_1_ = '\0';
          stack0xffffffffffffff35 = 0;
          doc_attr_list.super__List_base<Kumu::NVPair,_std::allocator<Kumu::NVPair>_>._M_impl.
          _M_node.super__List_node_base._M_next = (_List_node_base *)&PTR__IArchive_0011aaa8;
          Kumu::GenRandomValue((UUID *)&doc_attr_list);
          Info.CryptographicKeyID._0_4_ =
               doc_attr_list.super__List_base<Kumu::NVPair,_std::allocator<Kumu::NVPair>_>._M_impl.
               _M_node.super__List_node_base._M_prev._1_4_;
          Info.CryptographicKeyID._4_4_ =
               doc_attr_list.super__List_base<Kumu::NVPair,_std::allocator<Kumu::NVPair>_>._M_impl.
               _M_node._13_4_;
          Info.CryptographicKeyID._8_4_ =
               doc_attr_list.super__List_base<Kumu::NVPair,_std::allocator<Kumu::NVPair>_>._M_impl.
               _M_node._M_size._1_4_;
          Info.CryptographicKeyID._12_4_ = stack0xffffffffffffff35;
        }
        this = (AESEncContext *)operator_new(8);
        ASDCP::AESEncContext::AESEncContext(this);
        ASDCP::AESEncContext::InitKey((uchar *)&doc_attr_list);
        Kumu::Result_t::operator=(&result,(Result_t *)&doc_attr_list);
        Kumu::Result_t::~Result_t((Result_t *)&doc_attr_list);
        if (-1 < _result) {
          Kumu::FortunaRNG::FillRandom((uchar *)&RNG,(uint)IV_buf);
          ASDCP::AESEncContext::SetIVec((uchar *)&doc_attr_list);
          Kumu::Result_t::operator=(&result,(Result_t *)&doc_attr_list);
          Kumu::Result_t::~Result_t((Result_t *)&doc_attr_list);
          if ((-1 < _result) && (*(char *)(in_RSI + 4) == '\x01')) {
            Info.UsesHMAC = true;
            this_00 = (HMACContext *)operator_new(8);
            ASDCP::HMACContext::HMACContext(this_00);
            ASDCP::HMACContext::InitKey((uchar *)&doc_attr_list,(LabelSet_t)this_00);
            Kumu::Result_t::operator=(&result,(Result_t *)&doc_attr_list);
            Kumu::Result_t::~Result_t((Result_t *)&doc_attr_list);
          }
        }
        Kumu::FortunaRNG::~FortunaRNG(&RNG);
      }
      if (-1 < _result) {
        psVar1 = (string *)(in_RSI + 0x218);
        iVar7 = std::__cxx11::string::compare((char *)psVar1);
        if (iVar7 == 0) {
          IV_buf[8] = '\0';
          IV_buf[9] = '\0';
          IV_buf[10] = '\0';
          IV_buf[0xb] = '\0';
          IV_buf[0xc] = '\0';
          IV_buf[0xd] = '\0';
          IV_buf[0xe] = '\0';
          IV_buf[0xf] = '\0';
          local_228 = '\0';
          _RNG = &local_290;
          local_290 = 0;
          paVar2 = &namespace_name.field_2;
          namespace_name._M_string_length = 0;
          namespace_name.field_2._M_local_buf[0] = '\0';
          namespace_name._M_dataplus._M_p = (pointer)paVar2;
          IV_buf._0_8_ = &local_228;
          ASDCP::DCData::SequenceParser::ReadFrame((FrameBuffer *)&doc_attr_list);
          Kumu::Result_t::operator=(&result,(Result_t *)&doc_attr_list);
          Kumu::Result_t::~Result_t((Result_t *)&doc_attr_list);
          if (-1 < _result) {
            doc_attr_list.super__List_base<Kumu::NVPair,_std::allocator<Kumu::NVPair>_>._M_impl.
            _M_node.super__List_node_base._M_prev._0_1_ = SUB81((_List_node_base *)&doc_attr_list,0)
            ;
            doc_attr_list.super__List_base<Kumu::NVPair,_std::allocator<Kumu::NVPair>_>._M_impl.
            _M_node.super__List_node_base._M_prev._1_4_ = SUB84((ulong)&doc_attr_list >> 8,0);
            doc_attr_list.super__List_base<Kumu::NVPair,_std::allocator<Kumu::NVPair>_>._M_impl.
            _M_node.super__List_node_base._M_prev._5_3_ = (uint3)((ulong)&doc_attr_list >> 0x28);
            doc_attr_list.super__List_base<Kumu::NVPair,_std::allocator<Kumu::NVPair>_>._M_impl.
            _M_node._M_size._0_1_ = 0;
            doc_attr_list.super__List_base<Kumu::NVPair,_std::allocator<Kumu::NVPair>_>._M_impl.
            _M_node._M_size._1_1_ = '\0';
            doc_attr_list.super__List_base<Kumu::NVPair,_std::allocator<Kumu::NVPair>_>._M_impl.
            _M_node._M_size._2_1_ = '\0';
            doc_attr_list.super__List_base<Kumu::NVPair,_std::allocator<Kumu::NVPair>_>._M_impl.
            _M_node._M_size._3_1_ = '\0';
            doc_attr_list.super__List_base<Kumu::NVPair,_std::allocator<Kumu::NVPair>_>._M_impl.
            _M_node._M_size._4_1_ = '\0';
            stack0xffffffffffffff35 = stack0xffffffffffffff35 & 0xff000000;
            doc_attr_list.super__List_base<Kumu::NVPair,_std::allocator<Kumu::NVPair>_>._M_impl.
            _M_node.super__List_node_base._M_next = (_List_node_base *)&doc_attr_list;
            cVar6 = Kumu::GetXMLDocType((uchar *)FrameBuffer._8_8_,FrameBuffer._24_4_,
                                        (string *)IV_buf,(string *)&RNG,(string *)&namespace_name,
                                        (list *)&doc_attr_list);
            puVar11 = (undefined1 *)&Kumu::RESULT_FAIL;
            if (cVar6 != '\0') {
              puVar11 = Kumu::RESULT_OK;
            }
            Kumu::Result_t::operator=(&result,(Result_t *)puVar11);
            std::__cxx11::_List_base<Kumu::NVPair,_std::allocator<Kumu::NVPair>_>::_M_clear
                      (&doc_attr_list.super__List_base<Kumu::NVPair,_std::allocator<Kumu::NVPair>_>)
            ;
            if ((-1 < _result) && (namespace_name._M_string_length != 0)) {
              std::__cxx11::string::_M_assign(psVar1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)namespace_name._M_dataplus._M_p != paVar2) {
                operator_delete(namespace_name._M_dataplus._M_p,
                                CONCAT71(namespace_name.field_2._M_allocated_capacity._1_7_,
                                         namespace_name.field_2._M_local_buf[0]) + 1);
              }
              if (_RNG != &local_290) {
                operator_delete(_RNG,CONCAT71(uStack_28f,local_290) + 1);
              }
              if ((byte_t *)IV_buf._0_8_ != &local_228) {
                operator_delete((void *)IV_buf._0_8_,CONCAT71(abStack_227,local_228) + 1);
              }
              goto LAB_0010f1e0;
            }
          }
          fwrite("Unable to parse an XML namespace name from the input document.\n",0x3f,1,_stderr);
          Kumu::Result_t::Result_t((Result_t *)Options,(Result_t *)&Kumu::RESULT_FAIL);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)namespace_name._M_dataplus._M_p != paVar2) {
            operator_delete(namespace_name._M_dataplus._M_p,
                            CONCAT71(namespace_name.field_2._M_allocated_capacity._1_7_,
                                     namespace_name.field_2._M_local_buf[0]) + 1);
          }
          if (_RNG != &local_290) {
            operator_delete(_RNG,CONCAT71(uStack_28f,local_290) + 1);
          }
          if ((byte_t *)IV_buf._0_8_ != &local_228) {
            operator_delete((void *)IV_buf._0_8_,CONCAT71(abStack_227,local_228) + 1);
          }
          ASDCP::WriterInfo::~WriterInfo(&Info);
          goto LAB_0010f7c4;
        }
LAB_0010f1e0:
        IV_buf[0] = '\0';
        IV_buf[1] = '@';
        IV_buf[2] = '\0';
        IV_buf[3] = '\0';
        _RNG = (undefined1 *)CONCAT44(uStack_29c,1);
        namespace_name._M_dataplus._M_p._0_4_ = 10;
        AS_02::ISXD::MXFWriter::OpenWrite
                  ((string *)&doc_attr_list,(WriterInfo *)&Writer,(string *)(in_RSI + 0x268),
                   (Rational *)&Info,(uint *)psVar1,(IndexStrategy_t *)(in_RSI + 0x18),
                   (uint *)IV_buf);
        Kumu::Result_t::operator=(&result,(Result_t *)&doc_attr_list);
        Kumu::Result_t::~Result_t((Result_t *)&doc_attr_list);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)Info.ProductName._M_dataplus._M_p != paVar4) {
        operator_delete(Info.ProductName._M_dataplus._M_p,
                        Info.ProductName.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)Info.CompanyName._M_dataplus._M_p != paVar3) {
        operator_delete(Info.CompanyName._M_dataplus._M_p,
                        Info.CompanyName.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)Info.ProductVersion._M_dataplus._M_p != &Info.ProductVersion.field_2) {
        operator_delete(Info.ProductVersion._M_dataplus._M_p,
                        Info.ProductVersion.field_2._M_allocated_capacity + 1);
      }
      if (_result < 0) goto LAB_0010f7af;
    }
    ASDCP::DCData::SequenceParser::Reset();
    Kumu::Result_t::operator=(&result,(Result_t *)&Info);
    Kumu::Result_t::~Result_t((Result_t *)&Info);
    if ((-1 < _result) && (*(int *)(in_RSI + 0x10) != 0)) {
      uVar9 = 0;
      while( true ) {
        ASDCP::DCData::SequenceParser::ReadFrame((FrameBuffer *)&Info);
        Kumu::Result_t::operator=(&result,(Result_t *)&Info);
        Kumu::Result_t::~Result_t((Result_t *)&Info);
        if (_result < 0) break;
        if (*(char *)(in_RSI + 5) == '\x01') {
          ASDCP::DCData::FrameBuffer::Dump((_IO_FILE *)&FrameBuffer,(uint)_stderr);
        }
        if (*(char *)(in_RSI + 3) == '\x01') {
          FrameBuffer._36_4_ = 0;
        }
        if (_result < 0) break;
        if (*(char *)(in_RSI + 0xc) == '\0') {
          AS_02::ISXD::MXFWriter::WriteFrame
                    ((FrameBuffer *)&Info,(AESEncContext *)&Writer,(HMACContext *)&FrameBuffer);
          Kumu::Result_t::operator=(&result,(Result_t *)&Info);
          Kumu::Result_t::~Result_t((Result_t *)&Info);
        }
        if ((_result < 0) || (uVar9 = uVar9 + 1, *(uint *)(in_RSI + 0x10) <= uVar9)) break;
      }
    }
    if (_result == Kumu::RESULT_ENDOFFILE) {
      Kumu::Result_t::operator=(&result,(Result_t *)Kumu::RESULT_OK);
    }
    if ((-1 < _result) && (*(char *)(in_RSI + 0xc) == '\0')) {
      ASDCP::FrameBuffer::FrameBuffer((FrameBuffer *)IV_buf);
      plVar13 = *(long **)(in_RSI + 0x238);
      if (plVar13 != (long *)(in_RSI + 0x238)) {
        do {
          iVar7 = Kumu::FileSize((string *)(plVar13 + 2));
          ASDCP::FrameBuffer::Capacity((uint)&Info);
          Kumu::Result_t::operator=(&result,(Result_t *)&Info);
          Kumu::Result_t::~Result_t((Result_t *)&Info);
          if (-1 < _result) {
            Kumu::FileReader::FileReader((FileReader *)&doc_attr_list);
            _RNG = &local_290;
            local_290 = 0;
            Kumu::FileReader::OpenRead((string *)&Info);
            Kumu::Result_t::operator=(&result,(Result_t *)&Info);
            Kumu::Result_t::~Result_t((Result_t *)&Info);
            if (-1 < _result) {
              Kumu::FileReader::Read
                        (Info.ProductUUID,(uint)(FileReader *)&doc_attr_list,(uint *)IV_buf._8_8_);
              Kumu::Result_t::operator=(&result,(Result_t *)&Info);
              Kumu::Result_t::~Result_t((Result_t *)&Info);
              if (-1 < _result) {
                if (iVar7 != 0) {
                  Kumu::Result_t::Result_t((Result_t *)Options,(Result_t *)Kumu::RESULT_READFAIL);
                  if (_RNG != &local_290) {
                    operator_delete(_RNG,CONCAT71(uStack_28f,local_290) + 1);
                  }
                  Kumu::FileReader::~FileReader((FileReader *)&doc_attr_list);
                  ASDCP::FrameBuffer::~FrameBuffer((FrameBuffer *)IV_buf);
                  goto LAB_0010f7c4;
                }
                Info.ProductUUID._0_8_ = Info.AssetUUID;
                Info.ProductUUID[8] = '\0';
                Info.ProductUUID[9] = '\0';
                Info.ProductUUID[10] = '\0';
                Info.ProductUUID[0xb] = '\0';
                Info.ProductUUID[0xc] = '\0';
                Info.ProductUUID[0xd] = '\0';
                Info.ProductUUID[0xe] = '\0';
                Info.ProductUUID[0xf] = '\0';
                Info.AssetUUID._0_8_ = Info.AssetUUID._0_8_ & 0xffffffffffffff00;
                namespace_name._M_dataplus._M_p = (pointer)&namespace_name.field_2;
                namespace_name._M_string_length = 0;
                namespace_name.field_2._M_local_buf[0] = '\0';
                doc_attr_list_1.super__List_base<Kumu::NVPair,_std::allocator<Kumu::NVPair>_>.
                _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&doc_attr_list_1;
                doc_attr_list_1.super__List_base<Kumu::NVPair,_std::allocator<Kumu::NVPair>_>.
                _M_impl._M_node._M_size = 0;
                local_220 = iVar7;
                doc_attr_list_1.super__List_base<Kumu::NVPair,_std::allocator<Kumu::NVPair>_>.
                _M_impl._M_node.super__List_node_base._M_prev =
                     doc_attr_list_1.super__List_base<Kumu::NVPair,_std::allocator<Kumu::NVPair>_>.
                     _M_impl._M_node.super__List_node_base._M_next;
                cVar6 = Kumu::GetXMLDocType((uchar *)IV_buf._8_8_,0,(string *)&Info,
                                            (string *)&namespace_name,(string *)&RNG,
                                            (list *)doc_attr_list_1.
                                                                                                        
                                                  super__List_base<Kumu::NVPair,_std::allocator<Kumu::NVPair>_>
                                                  ._M_impl._M_node.super__List_node_base._M_next);
                puVar11 = Kumu::RESULT_OK;
                if (cVar6 == '\0') {
                  puVar11 = (undefined1 *)&Kumu::RESULT_FAIL;
                }
                Kumu::Result_t::operator=(&result,(Result_t *)puVar11);
                std::__cxx11::_List_base<Kumu::NVPair,_std::allocator<Kumu::NVPair>_>::_M_clear
                          (&doc_attr_list_1.
                            super__List_base<Kumu::NVPair,_std::allocator<Kumu::NVPair>_>);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)namespace_name._M_dataplus._M_p != &namespace_name.field_2) {
                  operator_delete(namespace_name._M_dataplus._M_p,
                                  CONCAT71(namespace_name.field_2._M_allocated_capacity._1_7_,
                                           namespace_name.field_2._M_local_buf[0]) + 1);
                }
                if ((byte_t *)Info.ProductUUID._0_8_ != Info.AssetUUID) {
                  operator_delete((void *)Info.ProductUUID._0_8_,Info.AssetUUID._0_8_ + 1);
                }
                if (-1 < _result) {
                  AS_02::ISXD::MXFWriter::AddDmsGenericPartUtf8Text
                            ((FrameBuffer *)&Info,(AESEncContext *)&Writer,(HMACContext *)IV_buf);
                  Kumu::Result_t::operator=(&result,(Result_t *)&Info);
                  Kumu::Result_t::~Result_t((Result_t *)&Info);
                  if (-1 < _result) {
                    namespace_name._M_dataplus._M_p = (pointer)0x0;
                    get_current_dms_text_descriptor
                              (&Writer,(GenericStreamTextBasedSet **)&namespace_name);
                    _Var5 = namespace_name._M_dataplus;
                    if (namespace_name._M_dataplus._M_p == (pointer)0x0) {
                      __assert_fail("text_object",
                                    "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/as-02-wrap.cpp"
                                    ,0x7c1,"Result_t write_isxd_file(CommandOptions &)");
                    }
                    ASDCP::MXF::UTF16String::operator=
                              ((UTF16String *)(namespace_name._M_dataplus._M_p + 0xe8),"text/xml");
                    ASDCP::MXF::UTF16String::UTF16String((UTF16String *)&Info,(string *)&RNG);
                    std::__cxx11::string::_M_assign((string *)(_Var5._M_p + 0x140));
                    _Var5._M_p[0x160] = '\x01';
                    if ((byte_t *)Info.ProductUUID._8_8_ != Info.AssetUUID + 8) {
                      operator_delete((void *)Info.ProductUUID._8_8_,Info.AssetUUID._8_8_ + 1);
                    }
                    ASDCP::MXF::UTF16String::operator=
                              ((UTF16String *)(_Var5._M_p + 0x110),(string *)(in_RSI + 0x168));
                  }
                }
              }
            }
            if (_RNG != &local_290) {
              operator_delete(_RNG,CONCAT71(uStack_28f,local_290) + 1);
            }
            Kumu::FileReader::~FileReader((FileReader *)&doc_attr_list);
          }
          plVar13 = (long *)*plVar13;
        } while (plVar13 != (long *)(in_RSI + 0x238));
      }
      if (-1 < _result) {
        AS_02::ISXD::MXFWriter::Finalize();
        Kumu::Result_t::operator=(&result,(Result_t *)&Info);
        Kumu::Result_t::~Result_t((Result_t *)&Info);
      }
      ASDCP::FrameBuffer::~FrameBuffer((FrameBuffer *)IV_buf);
    }
  }
LAB_0010f7af:
  Kumu::Result_t::Result_t((Result_t *)Options,&result);
LAB_0010f7c4:
  Kumu::Result_t::~Result_t(&result);
  ASDCP::DCData::SequenceParser::~SequenceParser(&Parser);
  ASDCP::FrameBuffer::~FrameBuffer(&FrameBuffer.super_FrameBuffer);
  AS_02::ISXD::MXFWriter::~MXFWriter(&Writer);
  return Options;
}

Assistant:

Result_t
write_isxd_file(CommandOptions& Options)
{
  AESEncContext*          Context = 0;
  HMACContext*            HMAC = 0;
  AS_02::ISXD::MXFWriter Writer;
  DCData::FrameBuffer     FrameBuffer(Options.fb_size);
  DCData::SequenceParser  Parser;

  // set up essence parser
  Result_t result = Parser.OpenRead(Options.filenames.front());

  // set up MXF writer
  if ( ASDCP_SUCCESS(result) )
    {

      if ( Options.verbose_flag )
	{
	  fprintf(stderr, "ISXD Data\n");
	  fprintf(stderr, "Frame Buffer size: %u\n", Options.fb_size);
	}
    }

  if ( ASDCP_SUCCESS(result) && ! Options.no_write_flag )
  {
    WriterInfo Info = s_MyInfo;  // fill in your favorite identifiers here
    if ( Options.asset_id_flag )
      memcpy(Info.AssetUUID, Options.asset_id_value, UUIDlen);
    else
      Kumu::GenRandomUUID(Info.AssetUUID);

    Info.LabelSetType = LS_MXF_SMPTE;

#ifdef HAVE_OPENSSL
      // configure encryption
    if( Options.key_flag )
	{
      byte_t                  IV_buf[CBC_BLOCK_SIZE];
      Kumu::FortunaRNG        RNG;
	  Kumu::GenRandomUUID(Info.ContextID);
	  Info.EncryptedEssence = true;

	  if ( Options.key_id_flag )
	    {
	      memcpy(Info.CryptographicKeyID, Options.key_id_value, UUIDlen);
	    }
	  else
	    {
	      create_random_uuid(Info.CryptographicKeyID);
	    }

	  Context = new AESEncContext;
	  result = Context->InitKey(Options.key_value);

	  if ( ASDCP_SUCCESS(result) )
	    result = Context->SetIVec(RNG.FillRandom(IV_buf, CBC_BLOCK_SIZE));

	  if ( ASDCP_SUCCESS(result) && Options.write_hmac )
      {
        Info.UsesHMAC = true;
        HMAC = new HMACContext;
        result = HMAC->InitKey(Options.key_value, Info.LabelSetType);
      }
	}
#endif // HAVE_OPENSSL

    if ( ASDCP_SUCCESS(result) )
      {
	if ( Options.isxd_document_namespace == "auto" )
	  {
	    // get ns of first item
	    std::string ns_prefix, type_name, namespace_name;
	    result = Parser.ReadFrame(FrameBuffer);

	    if ( ASDCP_SUCCESS(result) )
	      {
		Kumu::AttributeList doc_attr_list;
		result = GetXMLDocType(FrameBuffer.RoData(), FrameBuffer.Size(), ns_prefix, type_name,
				       namespace_name, doc_attr_list) ? RESULT_OK : RESULT_FAIL;
	      }

	    if ( ASDCP_SUCCESS(result) && ! namespace_name.empty() )
	      {
		Options.isxd_document_namespace = namespace_name;
	      }
	    else
	      {
		fprintf(stderr, "Unable to parse an XML namespace name from the input document.\n");
		return RESULT_FAIL;
	      }
	  }

	result = Writer.OpenWrite(Options.out_file, Info, Options.isxd_document_namespace, Options.edit_rate);
      }
  }

  if ( ASDCP_SUCCESS(result) )
    {
      ui32_t duration = 0;
      result = Parser.Reset();

      while ( ASDCP_SUCCESS(result) && duration++ < Options.duration )
	{
	  result = Parser.ReadFrame(FrameBuffer);

	  if ( ASDCP_SUCCESS(result) )
	    {
	      if ( Options.verbose_flag )
		FrameBuffer.Dump(stderr, Options.fb_dump_size);

	      if ( Options.encrypt_header_flag )
		FrameBuffer.PlaintextOffset(0);
	    }

	  if ( ASDCP_SUCCESS(result) && ! Options.no_write_flag )
	    {
	      result = Writer.WriteFrame(FrameBuffer, Context, HMAC);

	      // The Writer class will forward the last block of ciphertext
	      // to the encryption context for use as the IV for the next
	      // frame. If you want to use non-sequitur IV values, un-comment
	      // the following  line of code.
	      // if ( ASDCP_SUCCESS(result) && Options.key_flag )
	      //   Context->SetIVec(RNG.FillRandom(IV_buf, CBC_BLOCK_SIZE));
	    }
	}

      if ( result == RESULT_ENDOFFILE )
	{
	  result = RESULT_OK;
	}
    }
  
  if ( KM_SUCCESS(result) && ! Options.no_write_flag )
    {
      ASDCP::FrameBuffer global_metadata;
      std::list<std::string>::iterator i;
      
      for ( i = Options.global_isxd_metadata.begin(); i != Options.global_isxd_metadata.end(); ++i )
	{
	  ui32_t file_size = Kumu::FileSize(*i);
	  result = global_metadata.Capacity(file_size);

	  if ( KM_SUCCESS(result) )
	    {
	      ui32_t read_count = 0;
	      Kumu::FileReader Reader;
	      std::string namespace_name;

	      result = Reader.OpenRead(*i);

	      if ( KM_SUCCESS(result) )
		{
		  result = Reader.Read(global_metadata.Data(), file_size, &read_count);
		}

	      if ( KM_SUCCESS(result) )
		{
		  if ( file_size != read_count) 
		    return RESULT_READFAIL;

		  global_metadata.Size(read_count);
		  std::string ns_prefix, type_name;
		  Kumu::AttributeList doc_attr_list;
		  result = GetXMLDocType(global_metadata.RoData(), global_metadata.Size(), ns_prefix, type_name,
					 namespace_name, doc_attr_list) ? RESULT_OK : RESULT_FAIL;
		}

	      if ( KM_SUCCESS(result) )
		{
		  result = Writer.AddDmsGenericPartUtf8Text(global_metadata, Context, HMAC);
		}

	      if ( KM_SUCCESS(result) )
		{
		  ASDCP::MXF::GenericStreamTextBasedSet *text_object = 0;
		  get_current_dms_text_descriptor(Writer, text_object);
		  assert(text_object);
		  text_object->TextMIMEMediaType = "text/xml";
		  text_object->TextDataDescription = namespace_name;

		  // this is not really useful when inserting multiple objects because
		  // it cannot be set per object without some other CLI syntax for
		  // associating language codes with 2057 blobs, e.g., <filename>:<lang>
		  text_object->RFC5646TextLanguageCode = Options.language;
		}
	    }
	}

      if ( KM_SUCCESS(result) )
	{
	  result = Writer.Finalize();
	}
    }

  return result;
}